

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

ms * __thiscall llvm::APInt::magic(ms *__return_storage_ptr__,APInt *this)

{
  bool bVar1;
  uint uVar2;
  bool local_2ca;
  bool local_2c9;
  APInt local_2b0;
  APInt local_2a0;
  APInt local_290;
  APInt local_280;
  APInt local_270;
  APInt local_260;
  APInt local_250;
  APInt local_240;
  APInt local_230;
  APInt local_220;
  APInt local_210;
  APInt local_200;
  APInt local_1f0;
  APInt local_1e0;
  APInt local_1d0;
  APInt local_1c0;
  APInt local_1b0;
  APInt local_1a0;
  APInt local_190;
  APInt local_180;
  APInt local_170;
  APInt local_160;
  APInt local_150;
  APInt local_140;
  APInt local_130;
  APInt local_120;
  APInt local_110;
  APInt local_100;
  APInt local_f0;
  APInt local_e0;
  APInt local_d0;
  undefined1 local_b9;
  undefined1 local_b8 [8];
  APInt signedMin;
  APInt t;
  APInt r2;
  APInt q2;
  APInt r1;
  APInt q1;
  APInt delta;
  APInt anc;
  APInt ad;
  uint p;
  APInt *d;
  APInt *this_local;
  ms *mag;
  
  APInt((APInt *)&anc.BitWidth);
  APInt((APInt *)&delta.BitWidth);
  APInt((APInt *)&q1.BitWidth);
  APInt((APInt *)&r1.BitWidth);
  APInt((APInt *)&q2.BitWidth);
  APInt((APInt *)&r2.BitWidth);
  APInt((APInt *)&t.BitWidth);
  APInt((APInt *)&signedMin.BitWidth);
  uVar2 = getBitWidth(this);
  getSignedMinValue((APInt *)local_b8,uVar2);
  local_b9 = 0;
  ms::ms(__return_storage_ptr__);
  abs(&local_d0,(uint)this);
  operator=((APInt *)&anc.BitWidth,&local_d0);
  ~APInt(&local_d0);
  getBitWidth(this);
  lshr(&local_f0,(uint)this);
  llvm::operator+((llvm *)&local_e0,(APInt *)local_b8,&local_f0);
  operator=((APInt *)&signedMin.BitWidth,&local_e0);
  ~APInt(&local_e0);
  ~APInt(&local_f0);
  APInt(&local_120,(APInt *)&signedMin.BitWidth);
  llvm::operator-((llvm *)&local_110,&local_120,1);
  urem(&local_130,(APInt *)&signedMin.BitWidth);
  llvm::operator-((llvm *)&local_100,&local_110,&local_130);
  operator=((APInt *)&delta.BitWidth,&local_100);
  ~APInt(&local_100);
  ~APInt(&local_130);
  ~APInt(&local_110);
  ~APInt(&local_120);
  uVar2 = getBitWidth(this);
  ad._12_4_ = uVar2 - 1;
  udiv(&local_140,(APInt *)local_b8);
  operator=((APInt *)&r1.BitWidth,&local_140);
  ~APInt(&local_140);
  operator*(&local_160,(APInt *)&r1.BitWidth);
  llvm::operator-((llvm *)&local_150,(APInt *)local_b8,&local_160);
  operator=((APInt *)&q2.BitWidth,&local_150);
  ~APInt(&local_150);
  ~APInt(&local_160);
  udiv(&local_170,(APInt *)local_b8);
  operator=((APInt *)&r2.BitWidth,&local_170);
  ~APInt(&local_170);
  operator*(&local_190,(APInt *)&r2.BitWidth);
  llvm::operator-((llvm *)&local_180,(APInt *)local_b8,&local_190);
  operator=((APInt *)&t.BitWidth,&local_180);
  ~APInt(&local_180);
  ~APInt(&local_190);
  do {
    ad._12_4_ = ad._12_4_ + 1;
    operator<<(&local_1a0,(int)&r1 + 8);
    operator=((APInt *)&r1.BitWidth,&local_1a0);
    ~APInt(&local_1a0);
    operator<<(&local_1b0,(int)&q2 + 8);
    operator=((APInt *)&q2.BitWidth,&local_1b0);
    ~APInt(&local_1b0);
    bVar1 = uge((APInt *)&q2.BitWidth,(APInt *)&delta.BitWidth);
    if (bVar1) {
      APInt(&local_1d0,(APInt *)&r1.BitWidth);
      llvm::operator+((llvm *)&local_1c0,&local_1d0,1);
      operator=((APInt *)&r1.BitWidth,&local_1c0);
      ~APInt(&local_1c0);
      ~APInt(&local_1d0);
      APInt(&local_1f0,(APInt *)&q2.BitWidth);
      llvm::operator-((llvm *)&local_1e0,&local_1f0,(APInt *)&delta.BitWidth);
      operator=((APInt *)&q2.BitWidth,&local_1e0);
      ~APInt(&local_1e0);
      ~APInt(&local_1f0);
    }
    operator<<(&local_200,(int)&r2 + 8);
    operator=((APInt *)&r2.BitWidth,&local_200);
    ~APInt(&local_200);
    operator<<(&local_210,(int)&t + 8);
    operator=((APInt *)&t.BitWidth,&local_210);
    ~APInt(&local_210);
    bVar1 = uge((APInt *)&t.BitWidth,(APInt *)&anc.BitWidth);
    if (bVar1) {
      APInt(&local_230,(APInt *)&r2.BitWidth);
      llvm::operator+((llvm *)&local_220,&local_230,1);
      operator=((APInt *)&r2.BitWidth,&local_220);
      ~APInt(&local_220);
      ~APInt(&local_230);
      APInt(&local_250,(APInt *)&t.BitWidth);
      llvm::operator-((llvm *)&local_240,&local_250,(APInt *)&anc.BitWidth);
      operator=((APInt *)&t.BitWidth,&local_240);
      ~APInt(&local_240);
      ~APInt(&local_250);
    }
    APInt(&local_270,(APInt *)&anc.BitWidth);
    llvm::operator-((llvm *)&local_260,&local_270,(APInt *)&t.BitWidth);
    operator=((APInt *)&q1.BitWidth,&local_260);
    ~APInt(&local_260);
    ~APInt(&local_270);
    bVar1 = ult((APInt *)&r1.BitWidth,(APInt *)&q1.BitWidth);
    local_2c9 = true;
    if (!bVar1) {
      bVar1 = operator==((APInt *)&r1.BitWidth,(APInt *)&q1.BitWidth);
      local_2ca = false;
      if (bVar1) {
        local_2ca = operator==((APInt *)&q2.BitWidth,0);
      }
      local_2c9 = local_2ca;
    }
  } while (local_2c9 != false);
  APInt(&local_290,(APInt *)&r2.BitWidth);
  llvm::operator+((llvm *)&local_280,&local_290,1);
  operator=(&__return_storage_ptr__->m,&local_280);
  ~APInt(&local_280);
  ~APInt(&local_290);
  bVar1 = isNegative(this);
  if (bVar1) {
    APInt(&local_2b0,&__return_storage_ptr__->m);
    llvm::operator-((llvm *)&local_2a0,&local_2b0);
    operator=(&__return_storage_ptr__->m,&local_2a0);
    ~APInt(&local_2a0);
    ~APInt(&local_2b0);
  }
  uVar2 = getBitWidth(this);
  __return_storage_ptr__->s = ad._12_4_ - uVar2;
  local_b9 = 1;
  ~APInt((APInt *)local_b8);
  ~APInt((APInt *)&signedMin.BitWidth);
  ~APInt((APInt *)&t.BitWidth);
  ~APInt((APInt *)&r2.BitWidth);
  ~APInt((APInt *)&q2.BitWidth);
  ~APInt((APInt *)&r1.BitWidth);
  ~APInt((APInt *)&q1.BitWidth);
  ~APInt((APInt *)&delta.BitWidth);
  ~APInt((APInt *)&anc.BitWidth);
  return __return_storage_ptr__;
}

Assistant:

APInt::ms APInt::magic() const {
  const APInt& d = *this;
  unsigned p;
  APInt ad, anc, delta, q1, r1, q2, r2, t;
  APInt signedMin = APInt::getSignedMinValue(d.getBitWidth());
  struct ms mag;

  ad = d.abs();
  t = signedMin + (d.lshr(d.getBitWidth() - 1));
  anc = t - 1 - t.urem(ad);   // absolute value of nc
  p = d.getBitWidth() - 1;    // initialize p
  q1 = signedMin.udiv(anc);   // initialize q1 = 2p/abs(nc)
  r1 = signedMin - q1*anc;    // initialize r1 = rem(2p,abs(nc))
  q2 = signedMin.udiv(ad);    // initialize q2 = 2p/abs(d)
  r2 = signedMin - q2*ad;     // initialize r2 = rem(2p,abs(d))
  do {
    p = p + 1;
    q1 = q1<<1;          // update q1 = 2p/abs(nc)
    r1 = r1<<1;          // update r1 = rem(2p/abs(nc))
    if (r1.uge(anc)) {  // must be unsigned comparison
      q1 = q1 + 1;
      r1 = r1 - anc;
    }
    q2 = q2<<1;          // update q2 = 2p/abs(d)
    r2 = r2<<1;          // update r2 = rem(2p/abs(d))
    if (r2.uge(ad)) {   // must be unsigned comparison
      q2 = q2 + 1;
      r2 = r2 - ad;
    }
    delta = ad - r2;
  } while (q1.ult(delta) || (q1 == delta && r1 == 0));

  mag.m = q2 + 1;
  if (d.isNegative()) mag.m = -mag.m;   // resulting magic number
  mag.s = p - d.getBitWidth();          // resulting shift
  return mag;
}